

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall CP::vector<int>::resize(vector<int> *this,size_t n)

{
  ulong local_28;
  size_t i;
  int init;
  size_t n_local;
  vector<int> *this_local;
  
  if (this->mCap < n) {
    expand(this,n);
  }
  if (this->mSize < n) {
    for (local_28 = this->mSize; local_28 < n; local_28 = local_28 + 1) {
      this->mData[local_28] = 0;
    }
  }
  this->mSize = n;
  return;
}

Assistant:

void resize(size_t n) {
      if (n > mCap)
        expand(n);

      if (n > mSize) {
        T init = T();
        for (size_t i = mSize;i < n;i++) 
          mData[i] = init;
      }


      mSize = n;
    }